

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 11_struct_as_param.cpp
# Opt level: O0

travel_time combine_travel_time(travel_time tt1,travel_time tt2)

{
  travel_time tVar1;
  undefined4 local_20;
  undefined4 uStack_1c;
  travel_time tt2_local;
  travel_time tt1_local;
  travel_time total;
  
  tt2_local.mins = tt1.mins;
  uStack_1c = tt2.mins;
  tt2_local.hours = tt1.hours;
  local_20 = tt2.hours;
  tVar1.mins = (tt2_local.mins + uStack_1c) % 0x3c;
  tVar1.hours = tt2_local.hours + local_20 + (tt2_local.mins + uStack_1c) / 0x3c;
  return tVar1;
}

Assistant:

travel_time combine_travel_time(travel_time tt1, travel_time tt2) {
    travel_time total;
    total.mins = (tt1.mins + tt2.mins) % MIN_PER_HOUR;
    //  不用手动取整
    total.hours = (tt1.hours + tt2.hours) + (tt1.mins + tt2.mins) / MIN_PER_HOUR;
    //  尝试修改一下一个入参
    tt1.hours = 100;
    tt2.hours = 100;
    //  并不会改变实际入参的值
    return total;
}